

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

void Curl_ssl_close_all(Curl_easy *data)

{
  long lVar1;
  ulong uVar2;
  
  if (((data->state).session != (curl_ssl_session *)0x0) &&
     ((data->share == (Curl_share *)0x0 || ((data->share->specifier & 0x10) == 0)))) {
    lVar1 = 0;
    for (uVar2 = 0; uVar2 < (data->set).general_ssl.max_ssl_sessions; uVar2 = uVar2 + 1) {
      Curl_ssl_kill_session((curl_ssl_session *)((long)&((data->state).session)->name + lVar1));
      lVar1 = lVar1 + 0x88;
    }
    (*Curl_cfree)((data->state).session);
    (data->state).session = (curl_ssl_session *)0x0;
  }
  (*Curl_ssl->close_all)(data);
  return;
}

Assistant:

void Curl_ssl_close_all(struct Curl_easy *data)
{
  size_t i;
  /* kill the session ID cache if not shared */
  if(data->state.session && !SSLSESSION_SHARED(data)) {
    for(i = 0; i < data->set.general_ssl.max_ssl_sessions; i++)
      /* the single-killer function handles empty table slots */
      Curl_ssl_kill_session(&data->state.session[i]);

    /* free the cache data */
    Curl_safefree(data->state.session);
  }

  Curl_ssl->close_all(data);
}